

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::splatI8x16(Literal *__return_storage_ptr__,Literal *this)

{
  undefined1 local_1a0 [8];
  LaneArray<16> lanes;
  
  if ((this->type).id == 2) {
    memset((array<wasm::Literal,_16UL> *)local_1a0,0,0x180);
    std::array<wasm::Literal,_16UL>::fill((array<wasm::Literal,_16UL> *)local_1a0,this);
    Literal(__return_storage_ptr__,(LaneArray<16> *)local_1a0);
    std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)local_1a0);
    return __return_storage_ptr__;
  }
  __assert_fail("val.type == Ty",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                ,0x683,"Literal wasm::splat(const Literal &) [Ty = wasm::Type::i32, Lanes = 16]");
}

Assistant:

Literal Literal::splatI8x16() const { return splat<Type::i32, 16>(*this); }